

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

Position * __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Position::operator++(Position *this)

{
  char *pcVar1;
  
  pcVar1 = this->m_pos;
  if (pcVar1 != this->m_end) {
    if (*pcVar1 == '\n') {
      this->line = this->line + 1;
      this->m_last_col = this->col;
      this->col = 1;
    }
    else {
      this->col = this->col + 1;
    }
    this->m_pos = pcVar1 + 1;
  }
  return this;
}

Assistant:

constexpr Position &operator++() noexcept {
          if (m_pos != m_end) {
            if (*m_pos == '\n') {
              ++line;
              m_last_col = col;
              col = 1;
            } else {
              ++col;
            }

            ++m_pos;
          }
          return *this;
        }